

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::_OnChangedVtxOffset(ImDrawList *this)

{
  ImDrawCmd *pIVar1;
  long lVar2;
  ImDrawCmd IStack_38;
  
  this->_VtxCurrentIdx = 0;
  pIVar1 = (this->CmdBuffer).Data;
  lVar2 = (long)(this->CmdBuffer).Size;
  if (pIVar1[lVar2 + -1].ElemCount == 0) {
    pIVar1[lVar2 + -1].VtxOffset = (this->_CmdHeader).VtxOffset;
    return;
  }
  IStack_38.ElemCount = 0;
  IStack_38._36_4_ = 0;
  IStack_38.UserCallback = (ImDrawCallback)0x0;
  IStack_38.UserCallbackData = (void *)0x0;
  IStack_38.ClipRect.x = (this->_CmdHeader).ClipRect.x;
  IStack_38.ClipRect.y = (this->_CmdHeader).ClipRect.y;
  IStack_38.ClipRect.z = (this->_CmdHeader).ClipRect.z;
  IStack_38.ClipRect.w = (this->_CmdHeader).ClipRect.w;
  IStack_38.TextureId = (this->_CmdHeader).TextureId;
  IStack_38.VtxOffset = (this->_CmdHeader).VtxOffset;
  IStack_38.IdxOffset = (this->IdxBuffer).Size;
  ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,&IStack_38);
  return;
}

Assistant:

void ImDrawList::_OnChangedVtxOffset()
{
    // We don't need to compare curr_cmd->VtxOffset != _CmdHeader.VtxOffset because we know it'll be different at the time we call this.
    _VtxCurrentIdx = 0;
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    //IM_ASSERT(curr_cmd->VtxOffset != _CmdHeader.VtxOffset); // See #3349
    if (curr_cmd->ElemCount != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);
    curr_cmd->VtxOffset = _CmdHeader.VtxOffset;
}